

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::addGenMulArgumentConversion
          (HlslParseContext *this,TSourceLoc *loc,TFunction *call,TIntermTyped **args)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  TBasicType TVar4;
  int iVar5;
  undefined4 extraout_var;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar6;
  size_type sVar7;
  reference ppTVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined8 uVar9;
  undefined4 extraout_var_16;
  long *local_3e0;
  undefined1 local_3d0 [8];
  TType truncType_5;
  TType truncType_4;
  TType truncType_3;
  TType truncType_2;
  TType truncType_1;
  TType truncType;
  TIntermTyped *arg1;
  TIntermTyped *arg0;
  TIntermAggregate *argAggregate;
  TIntermTyped **args_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (*args == (TIntermTyped *)0x0) {
    local_3e0 = (long *)0x0;
  }
  else {
    iVar2 = (*((*args)->super_TIntermNode)._vptr_TIntermNode[6])();
    local_3e0 = (long *)CONCAT44(extraout_var,iVar2);
  }
  if (local_3e0 == (long *)0x0) {
LAB_00572e3e:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"expected: mul arguments","");
    return;
  }
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar6);
  if (sVar7 != 2) goto LAB_00572e3e;
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar6,0);
  iVar2 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
  arg1 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar6,1);
  iVar2 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
  truncType.spirvType = (TSpirvType *)CONCAT44(extraout_var_01,iVar2);
  uVar3 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x2b])();
  if (((uVar3 & 1) == 0) ||
     (uVar3 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x2b])
                        (), (uVar3 & 1) == 0)) {
    uVar3 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x2b])();
    if (((uVar3 & 1) == 0) ||
       (uVar3 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x29]
                )(), (uVar3 & 1) == 0)) {
      uVar3 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x29])();
      if (((uVar3 & 1) == 0) ||
         (uVar3 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                    [0x2b])(), (uVar3 & 1) == 0)) {
        uVar3 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x29])();
        if (((uVar3 & 1) != 0) &&
           (uVar3 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x29])(), (uVar3 & 1) != 0)) {
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
          iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                    [0x27])();
          if (iVar5 < iVar2) {
            TVar4 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x20])();
            iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
            uVar9 = *(undefined8 *)(CONCAT44(extraout_var_10,iVar2) + 8);
            iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
            uVar1 = *(ulong *)(CONCAT44(extraout_var_11,iVar2) + 8);
            iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x27])();
            iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x27])();
            TType::TType((TType *)&truncType_5.spirvType,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                         (TPrecisionQualifier)(uVar1 >> 0x19) & 7,0,iVar2,iVar5,false);
            arg1 = addConstructor(this,loc,arg1,(TType *)&truncType_5.spirvType);
            TType::~TType((TType *)&truncType_5.spirvType);
          }
          else {
            iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
            iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x27])();
            if (iVar2 < iVar5) {
              TVar4 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                        [0x20])();
              iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                        [0x21])();
              uVar9 = *(undefined8 *)(CONCAT44(extraout_var_12,iVar2) + 8);
              iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                        [0x21])();
              uVar1 = *(ulong *)(CONCAT44(extraout_var_13,iVar2) + 8);
              iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
              iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                        [0x28])();
              TType::TType((TType *)local_3d0,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                           (TPrecisionQualifier)(uVar1 >> 0x19) & 7,0,iVar2,iVar5,false);
              truncType.spirvType =
                   (TSpirvType *)
                   addConstructor(this,loc,(TIntermTyped *)truncType.spirvType,(TType *)local_3d0);
              TType::~TType((TType *)local_3d0);
            }
          }
        }
      }
      else {
        iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x26]
                )();
        iVar5 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
        if (iVar2 < iVar5) {
          TVar4 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x20])();
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
          uVar9 = *(undefined8 *)(CONCAT44(extraout_var_06,iVar2) + 8);
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
          uVar1 = *(ulong *)(CONCAT44(extraout_var_07,iVar2) + 8);
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x27])();
          iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                    [0x26])();
          TType::TType((TType *)&truncType_3.spirvType,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                       (TPrecisionQualifier)(uVar1 >> 0x19) & 7,0,iVar2,iVar5,false);
          arg1 = addConstructor(this,loc,arg1,(TType *)&truncType_3.spirvType);
          TType::~TType((TType *)&truncType_3.spirvType);
        }
        else {
          iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                    [0x26])();
          iVar5 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
          if (iVar5 < iVar2) {
            TVar4 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x20])();
            iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x21])();
            uVar9 = *(undefined8 *)(CONCAT44(extraout_var_08,iVar2) + 8);
            iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                      [0x21])();
            uVar1 = *(ulong *)(CONCAT44(extraout_var_09,iVar2) + 8);
            iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x28])();
            TType::TType((TType *)&truncType_4.spirvType,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                         (TPrecisionQualifier)(uVar1 >> 0x19) & 7,iVar2,0,0,false);
            truncType.spirvType =
                 (TSpirvType *)
                 addConstructor(this,loc,(TIntermTyped *)truncType.spirvType,
                                (TType *)&truncType_4.spirvType);
            TType::~TType((TType *)&truncType_4.spirvType);
          }
        }
      }
    }
    else {
      iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x26])();
      iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x27])
                        ();
      if (iVar2 < iVar5) {
        TVar4 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x20]
                )();
        iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x21]
                )();
        uVar9 = *(undefined8 *)(CONCAT44(extraout_var_02,iVar2) + 8);
        iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x21]
                )();
        uVar1 = *(ulong *)(CONCAT44(extraout_var_03,iVar2) + 8);
        iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x26])();
        iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x28]
                )();
        TType::TType((TType *)&truncType_1.spirvType,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                     (TPrecisionQualifier)(uVar1 >> 0x19) & 7,0,iVar2,iVar5,false);
        truncType.spirvType =
             (TSpirvType *)
             addConstructor(this,loc,(TIntermTyped *)truncType.spirvType,
                            (TType *)&truncType_1.spirvType);
        TType::~TType((TType *)&truncType_1.spirvType);
      }
      else {
        iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x26])();
        iVar5 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode[0x27]
                )();
        if (iVar5 < iVar2) {
          TVar4 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x20])();
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
          uVar9 = *(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8);
          iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x21])();
          uVar1 = *(ulong *)(CONCAT44(extraout_var_05,iVar2) + 8);
          iVar2 = (*(((TIntermTyped *)truncType.spirvType)->super_TIntermNode)._vptr_TIntermNode
                    [0x27])();
          TType::TType((TType *)&truncType_2.spirvType,TVar4,(TStorageQualifier)uVar9 & 0x7f,
                       (TPrecisionQualifier)(uVar1 >> 0x19) & 7,iVar2,0,0,false);
          arg1 = addConstructor(this,loc,arg1,(TType *)&truncType_2.spirvType);
          TType::~TType((TType *)&truncType_2.spirvType);
        }
      }
    }
  }
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar6,0);
  if (arg1 == (TIntermTyped *)*ppTVar8) {
    pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*local_3e0 + 400))();
    ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvVar6,1);
    if (truncType.spirvType == (TSpirvType *)*ppTVar8) goto LAB_005735db;
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
            (this,loc,"mul() matrix size mismatch","");
LAB_005735db:
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar6,0);
  *ppTVar8 = &arg1->super_TIntermNode;
  pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*local_3e0 + 400))();
  ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar6,1);
  *ppTVar8 = (value_type)truncType.spirvType;
  iVar2 = (*(arg1->super_TIntermNode)._vptr_TIntermNode[0x1f])();
  iVar5 = (*(call->super_TSymbol)._vptr_TSymbol[0x27])(call,0);
  *(ulong *)(CONCAT44(extraout_var_15,iVar5) + 8) = CONCAT44(extraout_var_14,iVar2);
  uVar9 = (**(code **)&((truncType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                       allocator[2].stack.
                       super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                       ._M_impl.super__Vector_impl_data)();
  iVar2 = (*(call->super_TSymbol)._vptr_TSymbol[0x27])(call,1);
  *(undefined8 *)(CONCAT44(extraout_var_16,iVar2) + 8) = uVar9;
  return;
}

Assistant:

void HlslParseContext::addGenMulArgumentConversion(const TSourceLoc& loc, TFunction& call, TIntermTyped*& args)
{
    TIntermAggregate* argAggregate = args ? args->getAsAggregate() : nullptr;

    if (argAggregate == nullptr || argAggregate->getSequence().size() != 2) {
        // It really ought to have two arguments.
        error(loc, "expected: mul arguments", "", "");
        return;
    }

    TIntermTyped* arg0 = argAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* arg1 = argAggregate->getSequence()[1]->getAsTyped();

    if (arg0->isVector() && arg1->isVector()) {
        // For:
        //    vec * vec: it's handled during intrinsic selection, so while we could do it here,
        //               we can also ignore it, which is easier.
    } else if (arg0->isVector() && arg1->isMatrix()) {
        // vec * mat: we clamp the vec if the mat col is smaller, else clamp the mat col.
        if (arg0->getVectorSize() < arg1->getMatrixCols()) {
            // vec is smaller, so truncate larger mat dimension
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  0, arg0->getVectorSize(), arg1->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        } else if (arg0->getVectorSize() > arg1->getMatrixCols()) {
            // vec is larger, so truncate vec to mat size
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  arg1->getMatrixCols());
            arg0 = addConstructor(loc, arg0, truncType);
        }
    } else if (arg0->isMatrix() && arg1->isVector()) {
        // mat * vec: we clamp the vec if the mat col is smaller, else clamp the mat col.
        if (arg1->getVectorSize() < arg0->getMatrixRows()) {
            // vec is smaller, so truncate larger mat dimension
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  0, arg0->getMatrixCols(), arg1->getVectorSize());
            arg0 = addConstructor(loc, arg0, truncType);
        } else if (arg1->getVectorSize() > arg0->getMatrixRows()) {
            // vec is larger, so truncate vec to mat size
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  arg0->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        }
    } else if (arg0->isMatrix() && arg1->isMatrix()) {
        // mat * mat: we clamp the smaller inner dimension to match the other matrix size.
        // Remember, HLSL Mrc = GLSL/SPIRV Mcr.
        if (arg0->getMatrixRows() > arg1->getMatrixCols()) {
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  0, arg0->getMatrixCols(), arg1->getMatrixCols());
            arg0 = addConstructor(loc, arg0, truncType);
        } else if (arg0->getMatrixRows() < arg1->getMatrixCols()) {
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  0, arg0->getMatrixRows(), arg1->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        }
    } else {
        // It's something with scalars: we'll just leave it alone.  Function selection will handle it
        // downstream.
    }

    // Warn if we altered one of the arguments
    if (arg0 != argAggregate->getSequence()[0] || arg1 != argAggregate->getSequence()[1])
        warn(loc, "mul() matrix size mismatch", "", "");

    // Put arguments back.  (They might be unchanged, in which case this is harmless).
    argAggregate->getSequence()[0] = arg0;
    argAggregate->getSequence()[1] = arg1;

    call[0].type = &arg0->getWritableType();
    call[1].type = &arg1->getWritableType();
}